

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator_factory.hpp
# Opt level: O1

unique_ptr<jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::make_dependent_required_validator
          (keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *parent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  _Tuple_impl<0UL,_jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  _Var3;
  json_type jVar4;
  dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *this_00;
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  __args;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_R8;
  initializer_list<jsoncons::jsonschema::uri_wrapper> __l;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
  dependent_required;
  uri schema_location;
  uri location;
  allocator_type local_4a1;
  _Head_base<0UL,_jsoncons::jsonschema::required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  local_4a0;
  _Tuple_impl<0UL,_jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  local_498;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_490;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_488;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_480;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_478;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_470;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_468;
  const_object_range_type local_430;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  local_410;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
  local_3f8;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_3c8;
  uri local_208;
  uri local_178;
  uri_wrapper local_e8;
  
  local_208.uri_string_._M_dataplus._M_p = (pointer)&local_208.uri_string_.field_2;
  local_498.
  super__Head_base<0UL,_jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
        )(_Head_base<0UL,_jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
          )this;
  local_490 = in_R8;
  local_488 = context;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,*(long *)&sch->field_0,
             &(((sch->field_0).long_str_.ptr_)->
              super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>).field_0x0 +
             *(long *)&sch->field_0);
  local_208.scheme_part_.first = *(unsigned_long *)&sch[2].field_0;
  local_208.scheme_part_.second = sch[2].field_0.int64_.val_;
  local_208.userinfo_part_.first = *(unsigned_long *)&sch[3].field_0;
  local_208.userinfo_part_.second = sch[3].field_0.int64_.val_;
  local_208.host_part_.first = *(unsigned_long *)&sch[4].field_0;
  local_208.host_part_.second = sch[4].field_0.int64_.val_;
  local_208.port_part_.first = *(unsigned_long *)&sch[5].field_0;
  local_208.port_part_.second = sch[5].field_0.int64_.val_;
  local_208.path_part_.first = *(unsigned_long *)&sch[6].field_0;
  local_208.path_part_.second = sch[6].field_0.int64_.val_;
  local_208.query_part_.first = *(unsigned_long *)&sch[7].field_0;
  local_208.query_part_.second = sch[7].field_0.int64_.val_;
  local_208.fragment_part_.first = *(unsigned_long *)&sch[8].field_0;
  local_208.fragment_part_.second = sch[8].field_0.int64_.val_;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3f8._M_impl.super__Rb_tree_header._M_header;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_480 = parent;
  local_478 = (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)sch;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3f8._M_impl.super__Rb_tree_header._M_header._M_left;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_range_abi_cxx11_
            (&local_430,
             (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)parent);
  local_470 = local_430.last_.it_._M_current;
  bVar2 = local_430.first_.has_value_ == local_430.last_.has_value_;
  if ((local_430.first_.has_value_ & local_430.last_.has_value_ & 1U) != 0) {
    bVar2 = local_430.first_.it_._M_current == local_430.last_.it_._M_current;
  }
  if (!bVar2) {
    __args._M_current = local_430.first_.it_._M_current;
    do {
      jVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type
                        (&(__args._M_current)->value_);
      if (jVar4 == array_value) {
        local_3c8.base_uri_.uri_.uri_string_._M_dataplus._M_p =
             (pointer)&local_3c8.base_uri_.uri_.uri_string_.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"dependentRequired","")
        ;
        compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ::make_schema_location(&local_178,local_478,(string *)&local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8.base_uri_.uri_.uri_string_._M_dataplus._M_p !=
            &local_3c8.base_uri_.uri_.uri_string_.field_2) {
          operator_delete(local_3c8.base_uri_.uri_.uri_string_._M_dataplus._M_p,
                          CONCAT71(local_3c8.base_uri_.uri_.uri_string_.field_2.
                                   _M_allocated_capacity._1_7_,
                                   local_3c8.base_uri_.uri_.uri_string_.field_2._M_local_buf[0]) + 1
                         );
        }
        uri_wrapper::uri_wrapper(&local_e8,&local_178);
        __l._M_len = 1;
        __l._M_array = &local_e8;
        std::
        vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ::vector(&local_410,__l,&local_4a1);
        local_468._M_buckets = &local_468._M_single_bucket;
        local_468._M_bucket_count = 1;
        local_468._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_468._M_element_count = 0;
        local_468._M_rehash_policy._M_max_load_factor = 1.0;
        local_468._M_rehash_policy._4_4_ = 0;
        local_468._M_rehash_policy._M_next_resize = 0;
        local_468._M_single_bucket = (__node_base_ptr)0x0;
        compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ::compilation_context
                  (&local_3c8,&local_410,
                   (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_468);
        make_required_validator
                  ((keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)&local_4a0,local_488,
                   (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   &local_3c8,&(__args._M_current)->value_);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>>
        ::
        _M_emplace_unique<std::__cxx11::string_const&,std::unique_ptr<jsoncons::jsonschema::required_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::required_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>>
                    *)&local_3f8,&(__args._M_current)->key_,
                   (unique_ptr<jsoncons::jsonschema::required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                    *)&local_4a0);
        if (local_4a0._M_head_impl !=
            (required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)0x0) {
          (*((local_4a0._M_head_impl)->
            super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            ).
            super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            .super_validation_message_factory._vptr_validation_message_factory[1])();
        }
        local_4a0._M_head_impl =
             (required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8.custom_message_._M_dataplus._M_p != &local_3c8.custom_message_.field_2) {
          operator_delete(local_3c8.custom_message_._M_dataplus._M_p,
                          local_3c8.custom_message_.field_2._M_allocated_capacity + 1);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_3c8.custom_messages_._M_h);
        if (local_3c8.id_.super__Optional_base<jsoncons::uri,_false,_false>._M_payload.
            super__Optional_payload<jsoncons::uri,_true,_false,_false>.
            super__Optional_payload_base<jsoncons::uri>._M_engaged == true) {
          local_3c8.id_.super__Optional_base<jsoncons::uri,_false,_false>._M_payload.
          super__Optional_payload<jsoncons::uri,_true,_false,_false>.
          super__Optional_payload_base<jsoncons::uri>._M_engaged = false;
          if (local_3c8.id_.super__Optional_base<jsoncons::uri,_false,_false>._M_payload.
              super__Optional_payload<jsoncons::uri,_true,_false,_false>.
              super__Optional_payload_base<jsoncons::uri>._M_payload._M_value.uri_string_.
              _M_dataplus._M_p !=
              (pointer)((long)&local_3c8.id_.super__Optional_base<jsoncons::uri,_false,_false>.
                               _M_payload.super__Optional_payload<jsoncons::uri,_true,_false,_false>
                               .super__Optional_payload_base<jsoncons::uri>._M_payload + 0x10)) {
            operator_delete((void *)local_3c8.id_.super__Optional_base<jsoncons::uri,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<jsoncons::uri,_true,_false,_false>.
                                    super__Optional_payload_base<jsoncons::uri>._M_payload._M_value.
                                    uri_string_._M_dataplus._M_p,
                            local_3c8.id_.super__Optional_base<jsoncons::uri,_false,_false>.
                            _M_payload.super__Optional_payload<jsoncons::uri,_true,_false,_false>.
                            super__Optional_payload_base<jsoncons::uri>._M_payload._16_8_ + 1);
          }
        }
        std::
        vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ::~vector(&local_3c8.uris_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8.base_uri_.identifier_._M_dataplus._M_p !=
            &local_3c8.base_uri_.identifier_.field_2) {
          operator_delete(local_3c8.base_uri_.identifier_._M_dataplus._M_p,
                          local_3c8.base_uri_.identifier_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8.base_uri_.uri_.uri_string_._M_dataplus._M_p !=
            &local_3c8.base_uri_.uri_.uri_string_.field_2) {
          operator_delete(local_3c8.base_uri_.uri_.uri_string_._M_dataplus._M_p,
                          CONCAT71(local_3c8.base_uri_.uri_.uri_string_.field_2.
                                   _M_allocated_capacity._1_7_,
                                   local_3c8.base_uri_.uri_.uri_string_.field_2._M_local_buf[0]) + 1
                         );
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_468);
        std::
        vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ::~vector(&local_410);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.identifier_._M_dataplus._M_p != &local_e8.identifier_.field_2) {
          operator_delete(local_e8.identifier_._M_dataplus._M_p,
                          local_e8.identifier_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.uri_.uri_string_._M_dataplus._M_p != &local_e8.uri_.uri_string_.field_2) {
          operator_delete(local_e8.uri_.uri_string_._M_dataplus._M_p,
                          local_e8.uri_.uri_string_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.uri_string_._M_dataplus._M_p != &local_178.uri_string_.field_2) {
          operator_delete(local_178.uri_string_._M_dataplus._M_p,
                          local_178.uri_string_.field_2._M_allocated_capacity + 1);
        }
      }
      __args._M_current = __args._M_current + 1;
      bVar2 = __args._M_current == local_470;
      if ((local_430.first_.has_value_ & local_430.last_.has_value_ & 1U) == 0) {
        bVar2 = local_430.first_.has_value_ == local_430.last_.has_value_;
      }
    } while (!bVar2);
  }
  this_00 = (dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)operator_new(0x118);
  paVar1 = &local_3c8.base_uri_.uri_.uri_string_.field_2;
  local_3c8.base_uri_.uri_.uri_string_._M_string_length = 0;
  local_3c8.base_uri_.uri_.uri_string_.field_2._M_local_buf[0] = '\0';
  local_3c8.base_uri_.uri_.uri_string_._M_dataplus._M_p = (pointer)paVar1;
  dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::dependent_required_validator
            (this_00,local_490,&local_208,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
              *)&local_3f8,(string *)&local_3c8);
  _Var3.
  super__Head_base<0UL,_jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       local_498.
       super__Head_base<0UL,_jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
       ._M_head_impl;
  *(dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    **)local_498.
       super__Head_base<0UL,_jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
       ._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.base_uri_.uri_.uri_string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c8.base_uri_.uri_.uri_string_._M_dataplus._M_p,
                    CONCAT71(local_3c8.base_uri_.uri_.uri_string_.field_2._M_allocated_capacity.
                             _1_7_,local_3c8.base_uri_.uri_.uri_string_.field_2._M_local_buf[0]) + 1
                   );
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree(&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.uri_string_._M_dataplus._M_p != &local_208.uri_string_.field_2) {
    operator_delete(local_208.uri_string_._M_dataplus._M_p,
                    local_208.uri_string_.field_2._M_allocated_capacity + 1);
  }
  return (unique_ptr<jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          )_Var3.
           super__Head_base<0UL,_jsoncons::jsonschema::dependent_required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
           ._M_head_impl;
}

Assistant:

std::unique_ptr<dependent_required_validator<Json>> make_dependent_required_validator( 
            const compilation_context<Json>& context, const Json& sch, const Json& parent)
        {
            uri schema_location = context.get_base_uri();
            std::map<std::string, keyword_validator_ptr_type> dependent_required;

            for (const auto& dep : sch.object_range())
            {
                switch (dep.value().type()) 
                {
                    case json_type::array_value:
                    {
                        auto location = context.make_schema_location("dependentRequired");
                        dependent_required.emplace(dep.key(), 
                            this->make_required_validator(compilation_context<Json>(std::vector<uri_wrapper>{{uri_wrapper{ location }}}),
                                dep.value(), sch));
                        break;
                    }
                    default:
                    {
                        break;
                    }
                }
            }

            return jsoncons::make_unique<dependent_required_validator<Json>>(parent, std::move(schema_location),
                std::move(dependent_required));
        }